

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O0

int Rwr_NodeRewrite(Rwr_Man_t *p,Cut_Man_t *pManCut,Abc_Obj_t *pNode,int fUpdateLevel,int fUseZeros,
                   int fPlaceEnable)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  uint *puVar5;
  Abc_Obj_t *pAVar6;
  abctime aVar7;
  Dec_Node_t *pDVar8;
  char *pcVar9;
  ulong uVar10;
  uint local_cc;
  int local_98;
  int local_94;
  int Counter;
  abctime clk2;
  abctime clk;
  int GainBest;
  int GainCur;
  int i;
  int nNodesSaveCur;
  int nNodesSaved;
  int Required;
  char *pPerm;
  uint local_58;
  uint uTruth;
  uint uTruthBest;
  uint uPhase;
  Abc_Obj_t *pFanin;
  Cut_Cut_t *pCut;
  Dec_Graph_t *pGraph;
  int fVeryVerbose;
  int fPlaceEnable_local;
  int fUseZeros_local;
  int fUpdateLevel_local;
  Abc_Obj_t *pNode_local;
  Cut_Man_t *pManCut_local;
  Rwr_Man_t *p_local;
  
  pGraph._0_4_ = 0;
  local_58 = 0;
  GainCur = -1;
  clk._4_4_ = 0xffffffff;
  clk._0_4_ = 0xffffffff;
  p->nNodesConsidered = p->nNodesConsidered + 1;
  pGraph._4_4_ = fPlaceEnable;
  fVeryVerbose = fUseZeros;
  fPlaceEnable_local = fUpdateLevel;
  _fUseZeros_local = pNode;
  pNode_local = (Abc_Obj_t *)pManCut;
  pManCut_local = (Cut_Man_t *)p;
  if (fUpdateLevel == 0) {
    local_98 = 1000000000;
  }
  else {
    local_98 = Abc_ObjRequiredLevel(pNode);
  }
  nNodesSaveCur = local_98;
  aVar3 = Abc_Clock();
  pFanin = (Abc_Obj_t *)Abc_NodeGetCutsRecursive(pNode_local,_fUseZeros_local,0,0);
  if (pFanin == (Abc_Obj_t *)0x0) {
    __assert_fail("pCut != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                  ,0x51,"int Rwr_NodeRewrite(Rwr_Man_t *, Cut_Man_t *, Abc_Obj_t *, int, int, int)")
    ;
  }
  aVar4 = Abc_Clock();
  pManCut_local[3].pCompareOld = (Cut_Cut_t *)((aVar4 - aVar3) + (long)pManCut_local[3].pCompareOld)
  ;
  aVar3 = Abc_Clock();
  pFanin = *(Abc_Obj_t **)&pFanin->Id;
  do {
    if (pFanin == (Abc_Obj_t *)0x0) {
      aVar4 = Abc_Clock();
      pManCut_local[3].pCompareNew =
           (Cut_Cut_t *)((aVar4 - aVar3) + (long)pManCut_local[3].pCompareNew);
      if ((uint)clk == 0xffffffff) {
        p_local._4_4_ = 0xffffffff;
      }
      else {
        for (GainBest = 0; iVar2 = GainBest,
            iVar1 = Vec_PtrSize((Vec_Ptr_t *)pManCut_local->pCompareOld), iVar2 < iVar1;
            GainBest = GainBest + 1) {
          pAVar6 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pManCut_local->pCompareOld,GainBest);
          _uTruthBest = pAVar6;
          pDVar8 = Dec_GraphNode((Dec_Graph_t *)pManCut_local->pStore1[1],GainBest);
          (pDVar8->field_2).pFunc = pAVar6;
        }
        uVar10 = (ulong)*(byte *)((long)&pManCut_local->vCutsOld->nCap + (ulong)local_58);
        *(int *)((long)pManCut_local->puTemp + uVar10 * 4 + 0x24) =
             *(int *)((long)pManCut_local->puTemp + uVar10 * 4 + 0x24) + 1;
        *(uint *)(pManCut_local->puTemp + 3) = (uint)clk + *(int *)(pManCut_local->puTemp + 3);
        if ((fVeryVerbose != 0) || (0 < (int)(uint)clk)) {
          *(int *)((long)pManCut_local->puTemp + 0x14) =
               *(int *)((long)pManCut_local->puTemp + 0x14) + 1;
        }
        if (((int)pGraph != 0) && (0 < (int)(uint)clk)) {
          pcVar9 = Abc_ObjName(_fUseZeros_local);
          printf("Node %6s :   ",pcVar9);
          printf("Fanins = %d. ",(ulong)pManCut_local->pCompareOld->uSign);
          printf("Save = %d.  ",(ulong)(uint)GainCur);
          printf("Add = %d.  ",(ulong)(GainCur - (uint)clk));
          printf("GAIN = %d.  ",(ulong)(uint)clk);
          if (pManCut_local->pStore1[1] == (Cut_Cut_t *)0x0) {
            local_cc = 0;
          }
          else {
            local_cc = Dec_GraphNodeNum((Dec_Graph_t *)pManCut_local->pStore1[1]);
          }
          printf("Cone = %d.  ",(ulong)local_cc);
          printf("Class = %d.  ",
                 (ulong)*(byte *)((long)&pManCut_local->vCutsOld->nCap + (ulong)local_58));
          printf("\n");
        }
        p_local._4_4_ = (uint)clk;
      }
      return p_local._4_4_;
    }
    if (3 < *(uint *)&pFanin->pNtk >> 0x1c) {
      puVar5 = Cut_CutReadTruth((Cut_Cut_t *)pFanin);
      pPerm._4_4_ = *puVar5 & 0xffff;
      _nNodesSaved = *(long *)(*(long *)&pManCut_local->EntrySize +
                              (long)(int)*(char *)((long)&pManCut_local->vCutsNew->nCap +
                                                  (ulong)pPerm._4_4_) * 8);
      uTruth = (uint)*(char *)((long)&pManCut_local->vNodeAttrs->nCap + (ulong)pPerm._4_4_);
      Vec_PtrClear((Vec_Ptr_t *)pManCut_local->pCompareNew);
      Vec_PtrFill((Vec_Ptr_t *)pManCut_local->pCompareNew,*(uint *)&pFanin->pNtk >> 0x1c,(void *)0x0
                 );
      for (GainBest = 0; GainBest < (int)(*(uint *)&pFanin->pNtk >> 0x1c); GainBest = GainBest + 1)
      {
        _uTruthBest = Abc_NtkObj(_fUseZeros_local->pNtk,
                                 (&(pFanin->vFanins).nCap)[(int)*(char *)(_nNodesSaved + GainBest)])
        ;
        if (_uTruthBest == (Abc_Obj_t *)0x0) {
          _uTruthBest = (Abc_Obj_t *)0x0;
          break;
        }
        _uTruthBest = Abc_ObjNotCond(_uTruthBest,
                                     (uint)((uTruth & 1 << ((byte)GainBest & 0x1f)) != 0));
        Vec_PtrWriteEntry((Vec_Ptr_t *)pManCut_local->pCompareNew,GainBest,_uTruthBest);
      }
      if (GainBest == *(uint *)&pFanin->pNtk >> 0x1c) {
        *(int *)((long)pManCut_local[3].pStore0 + 0xc) =
             *(int *)((long)pManCut_local[3].pStore0 + 0xc) + 1;
        local_94 = 0;
        for (GainBest = 0; iVar2 = GainBest,
            iVar1 = Vec_PtrSize((Vec_Ptr_t *)pManCut_local->pCompareNew), iVar2 < iVar1;
            GainBest = GainBest + 1) {
          _uTruthBest = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)pManCut_local->pCompareNew,GainBest);
          pAVar6 = Abc_ObjRegular(_uTruthBest);
          iVar2 = Abc_ObjFanoutNum(pAVar6);
          if (iVar2 == 1) {
            local_94 = local_94 + 1;
          }
        }
        if (local_94 < 3) {
          aVar4 = Abc_Clock();
          for (GainBest = 0; iVar2 = GainBest,
              iVar1 = Vec_PtrSize((Vec_Ptr_t *)pManCut_local->pCompareNew), iVar2 < iVar1;
              GainBest = GainBest + 1) {
            _uTruthBest = (Abc_Obj_t *)
                          Vec_PtrEntry((Vec_Ptr_t *)pManCut_local->pCompareNew,GainBest);
            pAVar6 = Abc_ObjRegular(_uTruthBest);
            (pAVar6->vFanouts).nSize = (pAVar6->vFanouts).nSize + 1;
          }
          Abc_NtkIncrementTravId(_fUseZeros_local->pNtk);
          i = Abc_NodeMffcLabelAig(_fUseZeros_local);
          for (GainBest = 0; iVar2 = GainBest,
              iVar1 = Vec_PtrSize((Vec_Ptr_t *)pManCut_local->pCompareNew), iVar2 < iVar1;
              GainBest = GainBest + 1) {
            _uTruthBest = (Abc_Obj_t *)
                          Vec_PtrEntry((Vec_Ptr_t *)pManCut_local->pCompareNew,GainBest);
            pAVar6 = Abc_ObjRegular(_uTruthBest);
            (pAVar6->vFanouts).nSize = (pAVar6->vFanouts).nSize + -1;
          }
          aVar7 = Abc_Clock();
          pManCut_local[3].puTemp[1] = (uint *)((aVar7 - aVar4) + (long)pManCut_local[3].puTemp[1]);
          aVar4 = Abc_Clock();
          pCut = (Cut_Cut_t *)
                 Rwr_CutEvaluate((Rwr_Man_t *)pManCut_local,_fUseZeros_local,(Cut_Cut_t *)pFanin,
                                 (Vec_Ptr_t *)pManCut_local->pCompareNew,i,nNodesSaveCur,
                                 (int *)((long)&clk + 4),pGraph._4_4_);
          aVar7 = Abc_Clock();
          pManCut_local[3].puTemp[0] = (uint *)((aVar7 - aVar4) + (long)pManCut_local[3].puTemp[0]);
          if ((pCut != (Cut_Cut_t *)0x0) && ((int)(uint)clk < (int)clk._4_4_)) {
            GainCur = i;
            clk._0_4_ = clk._4_4_;
            pManCut_local->pStore1[1] = pCut;
            *(uint *)pManCut_local->pStore1 = (uint)((uTruth & 0x10) != 0);
            puVar5 = Cut_CutReadTruth((Cut_Cut_t *)pFanin);
            local_58 = *puVar5 & 0xffff;
            Vec_PtrClear((Vec_Ptr_t *)pManCut_local->pCompareOld);
            for (GainBest = 0; iVar2 = GainBest,
                iVar1 = Vec_PtrSize((Vec_Ptr_t *)pManCut_local->pCompareNew), iVar2 < iVar1;
                GainBest = GainBest + 1) {
              _uTruthBest = (Abc_Obj_t *)
                            Vec_PtrEntry((Vec_Ptr_t *)pManCut_local->pCompareNew,GainBest);
              Vec_PtrPush((Vec_Ptr_t *)pManCut_local->pCompareOld,_uTruthBest);
            }
          }
        }
      }
      else {
        *(int *)pManCut_local[3].pStore1 = *(int *)pManCut_local[3].pStore1 + 1;
      }
    }
    pFanin = *(Abc_Obj_t **)&pFanin->Id;
  } while( true );
}

Assistant:

int Rwr_NodeRewrite( Rwr_Man_t * p, Cut_Man_t * pManCut, Abc_Obj_t * pNode, int fUpdateLevel, int fUseZeros, int fPlaceEnable )
{
    int fVeryVerbose = 0;
    Dec_Graph_t * pGraph;
    Cut_Cut_t * pCut;//, * pTemp;
    Abc_Obj_t * pFanin;
    unsigned uPhase;
    unsigned uTruthBest = 0; // Suppress "might be used uninitialized"
    unsigned uTruth;
    char * pPerm;
    int Required, nNodesSaved;
    int nNodesSaveCur = -1; // Suppress "might be used uninitialized"
    int i, GainCur = -1, GainBest = -1;
    abctime clk, clk2;//, Counter;

    p->nNodesConsidered++;
    // get the required times
    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the node's cuts
clk = Abc_Clock();
    pCut = (Cut_Cut_t *)Abc_NodeGetCutsRecursive( pManCut, pNode, 0, 0 );
    assert( pCut != NULL );
p->timeCut += Abc_Clock() - clk;

//printf( " %d", Rwr_CutCountNumNodes(pNode, pCut) );
/*
    Counter = 0;
    for ( pTemp = pCut->pNext; pTemp; pTemp = pTemp->pNext )
        Counter++;
    printf( "%d ", Counter );
*/
    // go through the cuts
clk = Abc_Clock();
    for ( pCut = pCut->pNext; pCut; pCut = pCut->pNext )
    {
        // consider only 4-input cuts
        if ( pCut->nLeaves < 4 )
            continue;
//            Cut_CutPrint( pCut, 0 ), printf( "\n" );

        // get the fanin permutation
        uTruth = 0xFFFF & *Cut_CutReadTruth(pCut);
        pPerm = p->pPerms4[ (int)p->pPerms[uTruth] ];
        uPhase = p->pPhases[uTruth];
        // collect fanins with the corresponding permutation/phase
        Vec_PtrClear( p->vFaninsCur );
        Vec_PtrFill( p->vFaninsCur, (int)pCut->nLeaves, 0 );
        for ( i = 0; i < (int)pCut->nLeaves; i++ )
        {
            pFanin = Abc_NtkObj( pNode->pNtk, pCut->pLeaves[(int)pPerm[i]] );
            if ( pFanin == NULL )
                break;
            pFanin = Abc_ObjNotCond(pFanin, ((uPhase & (1<<i)) > 0) );
            Vec_PtrWriteEntry( p->vFaninsCur, i, pFanin );
        }
        if ( i != (int)pCut->nLeaves )
        {
            p->nCutsBad++;
            continue;
        }
        p->nCutsGood++;

        {
            int Counter = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                if ( Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) == 1 )
                    Counter++;
            if ( Counter > 2 )
                continue;
        }

clk2 = Abc_Clock();
/*
        printf( "Considering: (" );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            printf( "%d ", Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) );
        printf( ")\n" );
*/
        // mark the fanin boundary 
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize++;

        // label MFFC with current ID
        Abc_NtkIncrementTravId( pNode->pNtk );
        nNodesSaved = Abc_NodeMffcLabelAig( pNode );
        // unmark the fanin boundary
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize--;
p->timeMffc += Abc_Clock() - clk2;

        // evaluate the cut
clk2 = Abc_Clock();
        pGraph = Rwr_CutEvaluate( p, pNode, pCut, p->vFaninsCur, nNodesSaved, Required, &GainCur, fPlaceEnable );
p->timeEval += Abc_Clock() - clk2;

        // check if the cut is better than the current best one
        if ( pGraph != NULL && GainBest < GainCur )
        {
            // save this form
            nNodesSaveCur = nNodesSaved;
            GainBest  = GainCur;
            p->pGraph  = pGraph;
            p->fCompl = ((uPhase & (1<<4)) > 0);
            uTruthBest = 0xFFFF & *Cut_CutReadTruth(pCut);
            // collect fanins in the
            Vec_PtrClear( p->vFanins );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                Vec_PtrPush( p->vFanins, pFanin );
        }
    }
p->timeRes += Abc_Clock() - clk;

    if ( GainBest == -1 )
        return -1;
/*
    if ( GainBest > 0 )
    {
        printf( "Class %d  ", p->pMap[uTruthBest] );
        printf( "Gain = %d. Node %d : ", GainBest, pNode->Id );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
            printf( "%d ", Abc_ObjRegular(pFanin)->Id );
        Dec_GraphPrint( stdout, p->pGraph, NULL, NULL );
        printf( "\n" );
    }
*/

//    printf( "%d", nNodesSaveCur - GainBest );
/*
    if ( GainBest > 0 )
    {
        if ( Rwr_CutIsBoolean( pNode, p->vFanins ) )
            printf( "b" );
        else
        {
            printf( "Node %d : ", pNode->Id );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
                printf( "%d ", Abc_ObjRegular(pFanin)->Id );
            printf( "a" );
        }
    }
*/
/*
    if ( GainBest > 0 )
        if ( p->fCompl )
            printf( "c" );
        else
            printf( "." );
*/

    // copy the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        Dec_GraphNode((Dec_Graph_t *)p->pGraph, i)->pFunc = pFanin;
/*
    printf( "(" );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        printf( " %d", Abc_ObjRegular(pFanin)->vFanouts.nSize - 1 );
    printf( " )  " );
*/
//    printf( "%d ", Rwr_NodeGetDepth_rec( pNode, p->vFanins ) );

    p->nScores[p->pMap[uTruthBest]]++;
    p->nNodesGained += GainBest;
    if ( fUseZeros || GainBest > 0 )
    {
        p->nNodesRewritten++;
    }

    // report the progress
    if ( fVeryVerbose && GainBest > 0 )
    {
        printf( "Node %6s :   ", Abc_ObjName(pNode) );
        printf( "Fanins = %d. ", p->vFanins->nSize );
        printf( "Save = %d.  ", nNodesSaveCur );
        printf( "Add = %d.  ",  nNodesSaveCur-GainBest );
        printf( "GAIN = %d.  ", GainBest );
        printf( "Cone = %d.  ", p->pGraph? Dec_GraphNodeNum((Dec_Graph_t *)p->pGraph) : 0 );
        printf( "Class = %d.  ", p->pMap[uTruthBest] );
        printf( "\n" );
    }
    return GainBest;
}